

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Matchers::HasSizeMatcher::~HasSizeMatcher(HasSizeMatcher *this)

{
  HasSizeMatcher *this_local;
  
  ~HasSizeMatcher(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

explicit HasSizeMatcher(std::size_t target_size):
                m_target_size(target_size)
            {}